

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall
TgBot::Api::setWebhook
          (Api *this,string *url,Ptr *certificate,int32_t maxConnection,
          StringArrayPtr *allowedUpdates)

{
  element_type *__args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *objects;
  allocator local_bd;
  int32_t maxConnection_local;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  string allowedUpdatesJson;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  ptree local_50;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  maxConnection_local = maxConnection;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,4);
  if (url->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[4],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [4])0x27369b,url);
  }
  __args_1 = (certificate->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (__args_1 != (element_type *)0x0) {
    allowedUpdatesJson._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [12])0x27377a,&__args_1->data,(bool *)&allowedUpdatesJson,
               &__args_1->mimeType,&__args_1->fileName);
  }
  if (maxConnection != 0x28) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [16])"max_connections",&maxConnection_local);
  }
  objects = (allowedUpdates->
            super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (objects !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/tgbot-cpp/src/Api.cpp:915:13)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/tgbot-cpp/src/Api.cpp:915:13)>
               ::_M_manager;
    TgTypeParser::parseArray<std::__cxx11::string>
              (&allowedUpdatesJson,(TgTypeParser *)&this->field_0x28,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_78,objects);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [16])"allowed_updates",&allowedUpdatesJson);
    std::__cxx11::string::~string((string *)&allowedUpdatesJson);
  }
  std::__cxx11::string::string((string *)&allowedUpdatesJson,"setWebhook",&local_bd);
  sendRequest(&local_50,this,&allowedUpdatesJson,&args);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_50);
  std::__cxx11::string::~string((string *)&allowedUpdatesJson);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  return;
}

Assistant:

void Api::setWebhook(const string& url, const InputFile::Ptr certificate, int32_t maxConnection, const StringArrayPtr &allowedUpdates) const {
    vector<HttpReqArg> args;
    args.reserve(4);
    if (!url.empty()) {
        args.emplace_back("url", url);
    }
    if (certificate != nullptr) {
        args.emplace_back("certificate", certificate->data, true, certificate->mimeType, certificate->fileName);
    }
    if (maxConnection != 40) {
        args.emplace_back("max_connections", maxConnection);
    }
    if (allowedUpdates != nullptr) {
        auto allowedUpdatesJson = _tgTypeParser.parseArray<string>(
            [](const string &s)->string {
                return s;
            }, *allowedUpdates);
        args.emplace_back("allowed_updates", allowedUpdatesJson);
    }

    sendRequest("setWebhook", args);
}